

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O1

void __thiscall SRUP_MSG::~SRUP_MSG(SRUP_MSG *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SRUP_MSG::~SRUP_MSG()
{
    delete[] m_version;
    delete[] m_msgtype;
    delete[] m_unsigned_message;
    delete[] m_signature;
    delete[] m_token;
    delete[] m_serialized;
    delete (m_sequence_ID);
    delete (m_sender_ID);
}